

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::IsAnyOffsetsAreInvalid(OffsetData *offset_data)

{
  pointer pvVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  
  pvVar1 = (offset_data->offsets).
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(offset_data->offsets).
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  bVar12 = lVar3 != 0;
  if (bVar12) {
    uVar4 = (lVar3 >> 3) * -0x5555555555555555;
    uVar5 = 0;
    do {
      lVar3 = *(long *)&pvVar1[uVar5].
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl;
      lVar6 = (long)*(pointer *)
                     ((long)&pvVar1[uVar5].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl + 8) - lVar3;
      bVar13 = lVar6 != 0;
      if (bVar13) {
        uVar7 = (lVar6 >> 3) * -0x5555555555555555;
        uVar8 = 0;
        do {
          plVar2 = *(long **)(lVar3 + uVar8 * 0x18);
          lVar6 = *(long *)(lVar3 + 8 + uVar8 * 0x18) - (long)plVar2;
          bVar14 = lVar6 != 0;
          if (bVar14) {
            if (0 < *plVar2) {
              uVar10 = lVar6 >> 3;
              uVar9 = 1;
              do {
                uVar11 = (ulong)uVar9;
                bVar14 = uVar11 < uVar10;
                if (uVar10 <= uVar11) goto LAB_001d0f49;
                uVar9 = uVar9 + 1;
              } while (0 < plVar2[uVar11]);
            }
            if (bVar14) {
              if (bVar13) {
                return bVar12;
              }
              break;
            }
          }
LAB_001d0f49:
          uVar8 = (ulong)((int)uVar8 + 1);
          bVar14 = uVar7 - uVar8 != 0;
          bVar13 = uVar8 <= uVar7 && bVar14;
        } while (uVar8 <= uVar7 && bVar14);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      bVar13 = uVar4 - uVar5 != 0;
      bVar12 = uVar5 <= uVar4 && bVar13;
    } while (uVar5 <= uVar4 && bVar13);
  }
  return bVar12;
}

Assistant:

static bool IsAnyOffsetsAreInvalid(const OffsetData& offset_data) {
  for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
    for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
      for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx)
        if (reinterpret_cast<const tinyexr::tinyexr_int64&>(offset_data.offsets[l][dy][dx]) <= 0)
          return true;

  return false;
}